

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURL * curl_easy_init(void)

{
  CURLcode CVar1;
  Curl_easy *in_RAX;
  Curl_easy *data;
  
  data = in_RAX;
  if (((initialized == 0) && (CVar1 = curl_global_init(3), CVar1 != CURLE_OK)) ||
     (CVar1 = Curl_open(&data), CVar1 != CURLE_OK)) {
    data = (CURL *)0x0;
  }
  return data;
}

Assistant:

struct Curl_easy *curl_easy_init(void)
{
  CURLcode result;
  struct Curl_easy *data;

  /* Make sure we inited the global SSL stuff */
  if(!initialized) {
    result = curl_global_init(CURL_GLOBAL_DEFAULT);
    if(result) {
      /* something in the global init failed, return nothing */
      DEBUGF(fprintf(stderr, "Error: curl_global_init failed\n"));
      return NULL;
    }
  }

  /* We use curl_open() with undefined URL so far */
  result = Curl_open(&data);
  if(result) {
    DEBUGF(fprintf(stderr, "Error: Curl_open failed\n"));
    return NULL;
  }

  return data;
}